

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O3

void SUNDlsMat_denseCopy(sunrealtype **a,sunrealtype **b,sunindextype m,sunindextype n)

{
  sunrealtype *psVar1;
  sunrealtype *psVar2;
  long lVar3;
  long lVar4;
  
  if (0 < n) {
    lVar3 = 0;
    do {
      if (0 < m) {
        psVar1 = a[lVar3];
        psVar2 = b[lVar3];
        lVar4 = 0;
        do {
          psVar2[lVar4] = psVar1[lVar4];
          lVar4 = lVar4 + 1;
        } while (m != lVar4);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != n);
  }
  return;
}

Assistant:

void SUNDlsMat_denseCopy(sunrealtype** a, sunrealtype** b, sunindextype m,
                         sunindextype n)
{
  sunindextype i, j;
  sunrealtype *a_col_j, *b_col_j;

  for (j = 0; j < n; j++)
  {
    a_col_j = a[j];
    b_col_j = b[j];
    for (i = 0; i < m; i++) { b_col_j[i] = a_col_j[i]; }
  }
}